

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O0

void hgdb::json::SymbolTable::FilenameClear::handle(ScopeBase *scope,string *filename)

{
  __type_conflict2 _Var1;
  int iVar2;
  ulong uVar3;
  undefined4 extraout_var;
  long local_30;
  string *ref;
  string *filename_local;
  ScopeBase *scope_local;
  
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) == 0) && (scope->parent != (ScopeBase *)0x0)) {
    if (scope->parent == (ScopeBase *)0x0) {
      local_30 = 0;
    }
    else {
      local_30 = __dynamic_cast(scope->parent,&ScopeBase::typeinfo,&Module::typeinfo,0);
    }
    if (local_30 == 0) {
      iVar2 = (*scope->parent->_vptr_ScopeBase[4])();
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(extraout_var,iVar2),filename);
      if (_Var1) {
        std::__cxx11::string::clear();
      }
    }
  }
  return;
}

Assistant:

static void handle(ScopeBase *scope, std::string &filename) {
            if (filename.empty()) return;
            if (!scope->parent) return;
            // top level scope need to have filename
            if (dynamic_cast<Module *>(scope->parent)) return;
            auto const &ref = scope->parent->get_filename();
            if (ref == filename) {
                // the parent already has this filename, don't need to store it
                filename.clear();
            }
        }